

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void * rw::wdgl::driverOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *this;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 536"
  ;
  this = (ObjPipeline *)(*DAT_00149858)(0x40,0x40000);
  rw::ObjPipeline::init(this,(EVP_PKEY_CTX *)0xc);
  this[1].super_Pipeline.pluginID = 0;
  (this->impl).instance = instance;
  (this->impl).uninstance = uninstance;
  *(undefined8 *)&this[1].super_Pipeline.platform = 0;
  this[1].impl.instance = (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0;
  **(undefined8 **)(engine + 0xb0) = this;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_WDGL]->defaultPipeline = makeDefaultPipeline();
	return o;
}